

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O1

pair<unsigned_char,_unsigned_char> __thiscall
MedianFilterCV_8U::getPairMedian(MedianFilterCV_8U *this,Mat *image,int y,int x,bool pairOnOneLine)

{
  byte bVar1;
  uchar uVar2;
  pair<unsigned_char,_unsigned_char> pVar3;
  size_t __n;
  long lVar4;
  int iVar5;
  size_t __n_1;
  int iVar6;
  undefined7 in_register_00000081;
  uchar *puVar7;
  uchar *puVar8;
  long lVar9;
  uchar __tmp;
  byte local_1e [6];
  uchar mergeResult [6];
  
  iVar5 = x;
  if ((int)CONCAT71(in_register_00000081,pairOnOneLine) != 0) {
    iVar5 = y;
  }
  if (iVar5 == 1) {
    if (pairOnOneLine) {
      lVar9 = (long)(y + -1);
      lVar4 = (long)x;
      this->thirdTempArray[0] =
           *(uchar *)(lVar4 + -1 + **(long **)(image + 0x48) * lVar9 + *(long *)(image + 0x10));
      this->thirdTempArray[1] =
           *(uchar *)(lVar4 + **(long **)(image + 0x48) * lVar9 + *(long *)(image + 0x10));
      this->thirdTempArray[2] =
           *(uchar *)(lVar4 + 1 + lVar9 * **(long **)(image + 0x48) + *(long *)(image + 0x10));
      lVar9 = (long)y;
      this->fourthTempArray[0] =
           *(uchar *)(lVar4 + -1 + **(long **)(image + 0x48) * lVar9 + *(long *)(image + 0x10));
      this->fourthTempArray[1] =
           *(uchar *)(lVar4 + **(long **)(image + 0x48) * lVar9 + *(long *)(image + 0x10));
      puVar8 = (uchar *)(lVar4 + lVar9 * **(long **)(image + 0x48) + *(long *)(image + 0x10) + 1);
    }
    else {
      lVar4 = (long)x;
      this->thirdTempArray[0] =
           *(uchar *)(lVar4 + -1 +
                     **(long **)(image + 0x48) * (long)(y + -1) + *(long *)(image + 0x10));
      this->thirdTempArray[1] =
           *(uchar *)(lVar4 + -1 + **(long **)(image + 0x48) * (long)y + *(long *)(image + 0x10));
      this->thirdTempArray[2] =
           *(uchar *)(lVar4 + -1 +
                     **(long **)(image + 0x48) * (long)(y + 1) + *(long *)(image + 0x10));
      this->fourthTempArray[0] =
           *(uchar *)(lVar4 + (long)(y + -1) * **(long **)(image + 0x48) + *(long *)(image + 0x10));
      this->fourthTempArray[1] =
           *(uchar *)(lVar4 + (long)y * **(long **)(image + 0x48) + *(long *)(image + 0x10));
      puVar8 = (uchar *)((long)(y + 1) * **(long **)(image + 0x48) + *(long *)(image + 0x10) + lVar4
                        );
    }
    this->fourthTempArray[2] = *puVar8;
    lVar4 = 0;
    do {
      iVar5 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar4);
      iVar6 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar4);
      bVar1 = this->thirdTempArray[iVar5];
      if (this->thirdTempArray[iVar6] < bVar1) {
        this->thirdTempArray[iVar5] = this->thirdTempArray[iVar6];
        this->thirdTempArray[iVar6] = bVar1;
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
    lVar4 = 0;
    do {
      iVar5 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar4);
      iVar6 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar4);
      bVar1 = this->fourthTempArray[iVar5];
      if (this->fourthTempArray[iVar6] < bVar1) {
        this->fourthTempArray[iVar5] = this->fourthTempArray[iVar6];
        this->fourthTempArray[iVar6] = bVar1;
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
  }
  lVar4 = 0;
  do {
    uVar2 = this->firstTempArray[lVar4];
    this->firstTempArray[lVar4] = this->thirdTempArray[lVar4];
    this->thirdTempArray[lVar4] = uVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    uVar2 = this->secondTempArray[lVar4];
    this->secondTempArray[lVar4] = this->fourthTempArray[lVar4];
    this->fourthTempArray[lVar4] = uVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (pairOnOneLine) {
    lVar9 = (long)(y + 1);
    lVar4 = (long)x;
    this->thirdTempArray[0] =
         *(uchar *)(lVar4 + -1 + **(long **)(image + 0x48) * lVar9 + *(long *)(image + 0x10));
    this->thirdTempArray[1] =
         *(uchar *)(lVar4 + **(long **)(image + 0x48) * lVar9 + *(long *)(image + 0x10));
    this->thirdTempArray[2] =
         *(uchar *)(lVar4 + 1 + lVar9 * **(long **)(image + 0x48) + *(long *)(image + 0x10));
    lVar9 = (long)(y + 2);
    this->fourthTempArray[0] =
         *(uchar *)(lVar4 + -1 + **(long **)(image + 0x48) * lVar9 + *(long *)(image + 0x10));
    this->fourthTempArray[1] =
         *(uchar *)(lVar4 + **(long **)(image + 0x48) * lVar9 + *(long *)(image + 0x10));
    puVar8 = (uchar *)(lVar4 + lVar9 * **(long **)(image + 0x48) + *(long *)(image + 0x10) + 1);
  }
  else {
    lVar4 = (long)x;
    this->thirdTempArray[0] =
         *(uchar *)(lVar4 + 1 + **(long **)(image + 0x48) * (long)(y + -1) + *(long *)(image + 0x10)
                   );
    this->thirdTempArray[1] =
         *(uchar *)(lVar4 + 1 + **(long **)(image + 0x48) * (long)y + *(long *)(image + 0x10));
    this->thirdTempArray[2] =
         *(uchar *)(lVar4 + 1 + **(long **)(image + 0x48) * (long)(y + 1) + *(long *)(image + 0x10))
    ;
    this->fourthTempArray[0] =
         *(uchar *)(lVar4 + 2 + (long)(y + -1) * **(long **)(image + 0x48) + *(long *)(image + 0x10)
                   );
    this->fourthTempArray[1] =
         *(uchar *)(lVar4 + 2 + (long)y * **(long **)(image + 0x48) + *(long *)(image + 0x10));
    puVar8 = (uchar *)(lVar4 + (long)(y + 1) * **(long **)(image + 0x48) + *(long *)(image + 0x10) +
                      2);
  }
  this->fourthTempArray[2] = *puVar8;
  lVar4 = 0;
  do {
    iVar5 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar4);
    iVar6 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar4);
    bVar1 = this->thirdTempArray[iVar5];
    if (this->thirdTempArray[iVar6] < bVar1) {
      this->thirdTempArray[iVar5] = this->thirdTempArray[iVar6];
      this->thirdTempArray[iVar6] = bVar1;
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  lVar4 = 0;
  do {
    iVar5 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar4);
    iVar6 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar4);
    bVar1 = this->fourthTempArray[iVar5];
    if (this->fourthTempArray[iVar6] < bVar1) {
      this->fourthTempArray[iVar5] = this->fourthTempArray[iVar6];
      this->fourthTempArray[iVar6] = bVar1;
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  lVar4 = 0;
  iVar5 = 0;
  iVar6 = 0;
  do {
    if ((iVar5 == 3) ||
       ((iVar6 != 3 && (this->secondTempArray[iVar6] < this->thirdTempArray[iVar5])))) {
      lVar9 = (long)iVar6;
      iVar6 = iVar6 + 1;
      puVar8 = this->secondTempArray + lVar9;
    }
    else {
      puVar8 = this->thirdTempArray + iVar5;
      iVar5 = iVar5 + 1;
    }
    local_1e[lVar4] = *puVar8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  iVar5 = 0;
  lVar4 = 5;
  iVar6 = 0;
  do {
    if ((iVar5 == 3) || ((iVar6 != 6 && (local_1e[iVar6] < this->firstTempArray[iVar5])))) {
      lVar9 = (long)iVar6;
      iVar6 = iVar6 + 1;
      puVar8 = local_1e + lVar9;
    }
    else {
      puVar8 = this->firstTempArray + iVar5;
      iVar5 = iVar5 + 1;
    }
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  iVar5 = 0;
  lVar4 = 5;
  iVar6 = 0;
  do {
    if ((iVar5 == 3) || ((iVar6 != 6 && (local_1e[iVar6] < this->fourthTempArray[iVar5])))) {
      lVar9 = (long)iVar6;
      iVar6 = iVar6 + 1;
      puVar7 = local_1e + lVar9;
    }
    else {
      puVar7 = this->fourthTempArray + iVar5;
      iVar5 = iVar5 + 1;
    }
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  pVar3.second = *puVar7;
  pVar3.first = *puVar8;
  return pVar3;
}

Assistant:

std::pair<uchar, uchar> MedianFilterCV_8U::getPairMedian(const cv::Mat &image, int y, int x, bool pairOnOneLine) {
    // PairOnOneLine - true, if we are looking for medians on one line,
    //                false, if on one column
    if ((x == 1 && !pairOnOneLine) || (y == 1 && pairOnOneLine)) {                         // 7 operations
        //if we are looking for median on second line or second column
        //need init must fill out and initialize third and fourth temp array
        if (pairOnOneLine) {                                                               // 1 operation
            initThreeAdjacentPixels(image, thirdTempArray, y - 1, x, pairOnOneLine);       // 14| 2 operations + operations of init(12)
            initThreeAdjacentPixels(image, fourthTempArray, y, x, pairOnOneLine);          // 13| 1 operations + operations of init(12)
        } else {
            initThreeAdjacentPixels(image, thirdTempArray, y, x - 1, pairOnOneLine);       // 13| 2 operations + operations of init(12)
            initThreeAdjacentPixels(image, fourthTempArray, y, x, pairOnOneLine);          // 13| 1 operations + operations of init(12)
        }

        sortThreeElements(thirdTempArray);                                                 // 43| 1 operations + operations of sort(42)
        sortThreeElements(fourthTempArray);                                                // 43| 1 operations + operations of sort(42)
    }

    // The values ​​sorted in the last step are written to first and second temp array
    std::swap(firstTempArray, thirdTempArray);                                             // 4 operations
    std::swap(secondTempArray, fourthTempArray);                                           // 4 operations

    if (pairOnOneLine) {                                                                   // 1 operation
        initThreeAdjacentPixels(image, thirdTempArray, y + 1, x, pairOnOneLine);           // 2 operations
        initThreeAdjacentPixels(image, fourthTempArray, y + 2, x, pairOnOneLine);          // 2 operations
    } else {
        initThreeAdjacentPixels(image, thirdTempArray, y, x + 1, pairOnOneLine);           // 2 operations
        initThreeAdjacentPixels(image, fourthTempArray, y, x + 2, pairOnOneLine);          // 2 operations
    }

    sortThreeElements(thirdTempArray);                                                     // 43| 1 operation + operations of sort(42)
    sortThreeElements(fourthTempArray);                                                    // 43| 1 operation + operations of sort(42)

    uchar mergeResult[6];                                                                  // 1 operation
    mergeTwoSortedArray(secondTempArray, 3, thirdTempArray, 3, mergeResult);               // 118| 1 operation + operations of merge(117)

    std::pair<uchar, uchar> pairOfMedians;                                                 // 1 operations

    pairOfMedians.first = getMedianOfTwoSortedArray(mergeResult, 6, firstTempArray, 3);    // 98| 3 operations + opeations of getMedian(95)
    pairOfMedians.second = getMedianOfTwoSortedArray(mergeResult, 6, fourthTempArray, 3);  // 98| 3 operations + opeations of getMedian(95)

    return pairOfMedians;                                                                  // 1 operation
}